

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesAttGroupInfo.cpp
# Opt level: O3

SchemaAttDef * __thiscall
xercesc_4_0::XercesAttGroupInfo::getAttDef(XercesAttGroupInfo *this,XMLCh *baseName,int uriId)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLSize_t XVar3;
  SchemaAttDef *pSVar4;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  XMLSize_t getAt;
  
  if (this->fAttributes == (RefVectorOf<xercesc_4_0::SchemaAttDef> *)0x0) {
    return (SchemaAttDef *)0x0;
  }
  XVar3 = (this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>).fCurCount;
  if (XVar3 != 0) {
    getAt = 0;
    do {
      pSVar4 = BaseRefVectorOf<xercesc_4_0::SchemaAttDef>::elementAt
                         (&this->fAttributes->super_BaseRefVectorOf<xercesc_4_0::SchemaAttDef>,getAt
                         );
      if (pSVar4->fAttName->fURIId == uriId) {
        pXVar5 = pSVar4->fAttName->fLocalPart;
        if (pXVar5 == baseName) {
          return pSVar4;
        }
        if ((baseName == (XMLCh *)0x0) || (pXVar6 = baseName, pXVar5 == (XMLCh *)0x0)) {
          if (baseName == (XMLCh *)0x0) {
            if (pXVar5 == (XMLCh *)0x0) {
              return pSVar4;
            }
          }
          else if (*baseName != L'\0' || pXVar5 == (XMLCh *)0x0) {
            if (*baseName == L'\0') {
              return pSVar4;
            }
            goto LAB_0033810f;
          }
LAB_00338109:
          if (*pXVar5 == L'\0') {
            return pSVar4;
          }
        }
        else {
          do {
            XVar1 = *pXVar6;
            if (XVar1 == L'\0') goto LAB_00338109;
            XVar2 = *pXVar5;
            pXVar5 = pXVar5 + 1;
            pXVar6 = pXVar6 + 1;
          } while (XVar1 == XVar2);
        }
      }
LAB_0033810f:
      getAt = getAt + 1;
    } while (getAt != XVar3);
  }
  return (SchemaAttDef *)0x0;
}

Assistant:

const SchemaAttDef* XercesAttGroupInfo::getAttDef(const XMLCh* const baseName,
                                                  const int uriId) const {

    // If no list, then return a null
    if (!fAttributes)
        return 0;

    XMLSize_t attSize = fAttributes->size();

    for (XMLSize_t i=0; i<attSize; i++) {

        const SchemaAttDef* attDef = fAttributes->elementAt(i);
        QName* attName = attDef->getAttName();

        if (uriId == (int) attName->getURI() &&
			XMLString::equals(baseName, attName->getLocalPart())) {

            return attDef;
        }
    }

    return 0;
}